

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68040_cinv(void)

{
  char *__format;
  
  if (((byte)g_cpu_type & 0x10) != 0) {
    switch(g_cpu_ir >> 3 & 3) {
    case 0:
      builtin_strncpy(g_dasm_str + 0x10," scope); (4)",0xd);
      builtin_strncpy(g_dasm_str,"cinv    (illegal",0x10);
      return;
    case 1:
      __format = "cinvl   %d, (A%d); (4)";
      break;
    case 2:
      __format = "cinvp   %d, (A%d); (4)";
      break;
    case 3:
      sprintf(g_dasm_str,"cinva   %d; (4)",(ulong)(g_cpu_ir >> 6 & 3));
      return;
    }
    sprintf(g_dasm_str,__format,(ulong)(g_cpu_ir >> 6 & 3),(ulong)(g_cpu_ir & 7));
    return;
  }
  if ((~g_cpu_ir & 0xf000) != 0) {
    d68000_illegal();
    return;
  }
  sprintf(g_dasm_str,"dc.w    $%04x; opcode 1111",(ulong)g_cpu_ir);
  return;
}

Assistant:

static void d68040_cinv(void)
{
	LIMIT_CPU_TYPES(M68040_PLUS);
	switch((g_cpu_ir>>3)&3)
	{
		case 0:
			sprintf(g_dasm_str, "cinv    (illegal scope); (4)");
			break;
		case 1:
			sprintf(g_dasm_str, "cinvl   %d, (A%d); (4)", (g_cpu_ir>>6)&3, g_cpu_ir&7);
			break;
		case 2:
			sprintf(g_dasm_str, "cinvp   %d, (A%d); (4)", (g_cpu_ir>>6)&3, g_cpu_ir&7);
			break;
		case 3:
			sprintf(g_dasm_str, "cinva   %d; (4)", (g_cpu_ir>>6)&3);
			break;
	}
}